

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O0

void __thiscall ZAP::Archive::buildLookupTable(Archive *this)

{
  undefined1 local_90 [8];
  Entry entry;
  char local_49;
  undefined1 local_48 [7];
  char c;
  string filename;
  uint32_t i;
  uint32_t tableSize;
  Archive *this_local;
  
  std::istream::seekg(this->stream,(anonymous_namespace)::TABLE_POS,DAT_001873c8);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ZAP::Archive::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ZAP::Archive::Entry>_>_>
  ::clear(&this->lookupTable);
  filename.field_2._12_4_ = 0;
  anon_unknown.dwarf_136a6::readField<unsigned_int>
            (this->stream,(uint *)(filename.field_2._M_local_buf + 0xc));
  for (filename.field_2._8_4_ = 0; (uint)filename.field_2._8_4_ < (uint)filename.field_2._12_4_;
      filename.field_2._8_4_ = filename.field_2._8_4_ + 1) {
    std::__cxx11::string::string((string *)local_48);
    local_49 = '\0';
    while( true ) {
      std::istream::read((char *)this->stream,(long)&local_49);
      if (local_49 == '\0') break;
      std::__cxx11::string::operator+=((string *)local_48,local_49);
    }
    std::__cxx11::string::string((string *)local_90);
    entry.virtual_path.field_2._8_4_ = 0;
    entry.virtual_path.field_2._12_4_ = 0;
    entry.index = 0;
    std::__cxx11::string::operator=((string *)local_90,(string *)local_48);
    anon_unknown.dwarf_136a6::readField<unsigned_int>
              (this->stream,(uint *)(entry.virtual_path.field_2._M_local_buf + 8));
    anon_unknown.dwarf_136a6::readField<unsigned_int>
              (this->stream,(uint *)(entry.virtual_path.field_2._M_local_buf + 0xc));
    anon_unknown.dwarf_136a6::readField<unsigned_int>(this->stream,&entry.index);
    std::
    unordered_map<std::__cxx11::string,ZAP::Archive::Entry,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ZAP::Archive::Entry>>>
    ::emplace<std::__cxx11::string&,ZAP::Archive::Entry&>
              ((unordered_map<std::__cxx11::string,ZAP::Archive::Entry,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ZAP::Archive::Entry>>>
                *)&this->lookupTable,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               (Entry *)local_90);
    Entry::~Entry((Entry *)local_90);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void Archive::buildLookupTable()
	{
		// We assume that stream is open
		stream->seekg(TABLE_POS);
		lookupTable.clear();

		std::uint32_t tableSize = 0;
		readField(stream, &tableSize);

		for (uint32_t i = 0; i < tableSize; ++i)
		{
			std::string filename;

			char c = '\0';
			for(;;)
			{
				stream->read(&c, 1);

				if (c == '\0')
					break;

				filename += c;
			}

			Entry entry {};
			entry.virtual_path = filename;
			readField(stream, &entry.index);
			readField(stream, &entry.decompressed_size);
			readField(stream, &entry.compressed_size);

			lookupTable.emplace(filename, entry);
		}
	}